

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

void Aig_NodeUnionLists(Vec_Ptr_t *vArr1,Vec_Ptr_t *vArr2,Vec_Ptr_t *vArr)

{
  void **ppvVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  void **__ptr;
  void **ppvVar6;
  int iVar7;
  int iVar8;
  void **ppvVar9;
  void **ppvVar10;
  
  ppvVar10 = vArr1->pArray;
  ppvVar9 = vArr2->pArray;
  iVar5 = vArr1->nSize;
  iVar2 = vArr2->nSize;
  iVar7 = iVar2 + iVar5;
  iVar8 = vArr->nCap;
  __ptr = vArr->pArray;
  if (iVar8 < iVar7) {
    if (__ptr == (void **)0x0) {
      __ptr = (void **)malloc((long)iVar7 << 3);
    }
    else {
      __ptr = (void **)realloc(__ptr,(long)iVar7 << 3);
    }
    vArr->pArray = __ptr;
    vArr->nCap = iVar7;
    iVar8 = iVar7;
  }
  ppvVar6 = ppvVar10 + iVar5;
  ppvVar1 = ppvVar9 + iVar2;
  if (0 < iVar2 && 0 < iVar5) {
    do {
      pvVar3 = *ppvVar10;
      pvVar4 = *ppvVar9;
      iVar5 = *(int *)((long)pvVar4 + 0x24);
      if (*(int *)((long)pvVar3 + 0x24) == iVar5) {
        ppvVar10 = ppvVar10 + 1;
        *__ptr = pvVar3;
        ppvVar9 = ppvVar9 + 1;
      }
      else if (*(int *)((long)pvVar3 + 0x24) < iVar5) {
        ppvVar10 = ppvVar10 + 1;
        *__ptr = pvVar3;
      }
      else {
        ppvVar9 = ppvVar9 + 1;
        *__ptr = pvVar4;
      }
      __ptr = __ptr + 1;
    } while ((ppvVar10 < ppvVar6) && (ppvVar9 < ppvVar1));
  }
  for (; ppvVar10 < ppvVar6; ppvVar10 = ppvVar10 + 1) {
    *__ptr = *ppvVar10;
    __ptr = __ptr + 1;
  }
  for (; ppvVar9 < ppvVar1; ppvVar9 = ppvVar9 + 1) {
    *__ptr = *ppvVar9;
    __ptr = __ptr + 1;
  }
  iVar5 = (int)((ulong)((long)__ptr - (long)vArr->pArray) >> 3);
  vArr->nSize = iVar5;
  if (iVar8 < iVar5) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigUtil.c"
                  ,0x4e8,"void Aig_NodeUnionLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (iVar5 < vArr1->nSize) {
    __assert_fail("vArr->nSize >= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigUtil.c"
                  ,0x4e9,"void Aig_NodeUnionLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (iVar5 < vArr2->nSize) {
    __assert_fail("vArr->nSize >= vArr2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigUtil.c"
                  ,0x4ea,"void Aig_NodeUnionLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  return;
}

Assistant:

void Aig_NodeUnionLists( Vec_Ptr_t * vArr1, Vec_Ptr_t * vArr2, Vec_Ptr_t * vArr )
{
    Aig_Obj_t ** pBeg  = (Aig_Obj_t **)vArr->pArray;
    Aig_Obj_t ** pBeg1 = (Aig_Obj_t **)vArr1->pArray;
    Aig_Obj_t ** pBeg2 = (Aig_Obj_t **)vArr2->pArray;
    Aig_Obj_t ** pEnd1 = (Aig_Obj_t **)vArr1->pArray + vArr1->nSize;
    Aig_Obj_t ** pEnd2 = (Aig_Obj_t **)vArr2->pArray + vArr2->nSize;
    Vec_PtrGrow( vArr, Vec_PtrSize(vArr1) + Vec_PtrSize(vArr2) );
    pBeg  = (Aig_Obj_t **)vArr->pArray;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( (*pBeg1)->Id == (*pBeg2)->Id )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( (*pBeg1)->Id < (*pBeg2)->Id )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    vArr->nSize = pBeg - (Aig_Obj_t **)vArr->pArray;
    assert( vArr->nSize <= vArr->nCap );
    assert( vArr->nSize >= vArr1->nSize );
    assert( vArr->nSize >= vArr2->nSize );
}